

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile.cc
# Opt level: O1

void __thiscall
brown::Tile::print6x8(Tile *this,int ox,int y,uint32_t fcol,uint32_t bcol,char *fmt,...)

{
  bool bVar1;
  char in_AL;
  int iVar2;
  long lVar3;
  char cVar4;
  uint32_t uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  char *pcVar10;
  long lVar11;
  uint uVar12;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list arglist;
  char st [1024];
  undefined8 local_508;
  undefined1 *local_500;
  undefined1 *local_4f8;
  undefined1 local_4e8 [48];
  undefined8 local_4b8;
  undefined8 local_4a8;
  undefined8 local_498;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined8 local_448;
  char local_438;
  char local_437 [1022];
  undefined1 local_39;
  
  if (in_AL != '\0') {
    local_4b8 = in_XMM0_Qa;
    local_4a8 = in_XMM1_Qa;
    local_498 = in_XMM2_Qa;
    local_488 = in_XMM3_Qa;
    local_478 = in_XMM4_Qa;
    local_468 = in_XMM5_Qa;
    local_458 = in_XMM6_Qa;
    local_448 = in_XMM7_Qa;
  }
  if (fmt != (char *)0x0) {
    local_4f8 = local_4e8;
    local_500 = &stack0x00000008;
    local_508 = 0x3000000030;
    iVar2 = vsnprintf(&local_438,0x3ff,fmt,&local_508);
    if (iVar2 != 0) {
      local_39 = 0;
    }
    lVar3 = (long)y * (long)this->p + this->f;
    uVar6 = 1;
    do {
      if ((uint)y < (uint)this->y && local_438 != '\0') {
        pcVar10 = &local_438;
        cVar4 = local_438;
        iVar2 = ox;
        do {
          uVar12 = -iVar2;
          uVar9 = 0;
          if (iVar2 < 0) {
            uVar9 = uVar12;
          }
          uVar8 = this->x - iVar2;
          if (5 < (int)uVar8) {
            uVar8 = 6;
          }
          if ((int)uVar9 < (int)uVar8) {
            uVar7 = (ulong)uVar9;
            lVar11 = 0;
            do {
              uVar5 = fcol;
              if ((uVar6 & (int)(char)font6x8[lVar11 + uVar7 + (long)cVar4 * 6]) == 0) {
                uVar5 = bcol;
              }
              *(uint32_t *)(uVar7 * 4 + (long)iVar2 * 4 + lVar3 + lVar11 * 4) = uVar5;
              lVar11 = lVar11 + 1;
            } while (uVar8 - uVar7 != lVar11);
          }
          if (cVar4 == '\t') {
            if ((int)uVar12 < 7) {
              uVar12 = 6;
            }
            uVar9 = this->x - iVar2;
            if (0x11 < (int)uVar9) {
              uVar9 = 0x12;
            }
            if ((int)uVar12 < (int)uVar9) {
              uVar7 = (ulong)uVar12;
              do {
                *(uint32_t *)(lVar3 + (long)iVar2 * 4 + uVar7 * 4) = bcol;
                uVar7 = uVar7 + 1;
              } while (uVar9 != uVar7);
            }
            iVar2 = iVar2 + 0xc;
          }
          iVar2 = iVar2 + 6;
          cVar4 = pcVar10[1];
          pcVar10 = pcVar10 + 1;
        } while (cVar4 != '\0');
      }
      y = y + 1;
      lVar3 = lVar3 + this->p;
      bVar1 = (int)uVar6 < 0x80;
      uVar6 = uVar6 * 2;
    } while (bVar1);
  }
  return;
}

Assistant:

void Tile::print6x8 (int ox, int y, std::uint32_t fcol, std::uint32_t bcol, const char *fmt, ...)
{
    std::va_list arglist;
    char st[1024], *c, *v;
    int i, j, ie, x;
    std::uint32_t *lp, *lpx;

    if (!fmt) return;
    va_start(arglist,fmt);
    if (vsnprintf((char *)&st,sizeof(st)-1,fmt,arglist)) st[sizeof(st)-1] = 0;
    va_end(arglist);

    lp = (std::uint32_t *)(y*this->p+this->f);
    for(j=1;j<256;y++,lp=(std::uint32_t *)(((intptr_t)lp)+this->p),j+=j)
        if ((unsigned)y < (unsigned)this->y)
            for(c=st,x=ox;*c;c++,x+=6)
            {
                v = ((int)(*c))*6 + ((char *)font6x8); lpx = &lp[x];
                for(i=max(-x,0),ie=min(this->x-x,6);i<ie;i++) { if (v[i]&j) lpx[i] = fcol; else if (bcol >= 0) lpx[i] = bcol; }
                if ((*c) == 9) { if (bcol >= 0) { for(i=max(-x,6),ie=min(this->x-x,18);i<ie;i++) lpx[i] = bcol; } x += 2*6; }
            }
}